

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
initialize_with_string_view
          (basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          string_view_type sv,error_code *ec)

{
  type tVar1;
  error_code local_res8;
  error_code local_40;
  error_code local_30;
  
  tVar1 = unicode_traits::detect_json_encoding<char>(sv._M_str,sv._M_len);
  if (tVar1.encoding < utf16le) {
    (this->parser_).begin_input_ = tVar1.ptr;
    (this->parser_).end_input_ = sv._M_str + sv._M_len;
    (this->parser_).input_ptr_ = tVar1.ptr;
    if (((this->parser_).done_ == false) && ((this->done_ & 1U) == 0)) {
      local_40._M_value = 0;
      local_40._M_cat = (error_category *)std::_V2::system_category();
      read_next(this,&(this->cursor_visitor_).super_basic_json_visitor<char>,&local_40);
      if (local_40._M_value != 0) {
        std::error_code::error_code<jsoncons::json_errc,void>(&local_30,unexpected_eof);
        if ((local_40._M_cat == local_30._M_cat) && (local_40._M_value == local_30._M_value)) {
          this->done_ = true;
        }
        else {
          *(ulong *)ec = CONCAT44(local_40._4_4_,local_40._M_value);
          ec->_M_cat = local_40._M_cat;
        }
      }
    }
    return;
  }
  std::error_code::operator=(ec,illegal_unicode_character);
  return;
}

Assistant:

void initialize_with_string_view(string_view_type sv, std::error_code& ec)
    {
        auto r = unicode_traits::detect_json_encoding(sv.data(), sv.size());
        if (!(r.encoding == unicode_traits::encoding_kind::utf8 || r.encoding == unicode_traits::encoding_kind::undetected))
        {
            ec = json_errc::illegal_unicode_character;
            return;
        }
        std::size_t offset = (r.ptr - sv.data());
        parser_.update(sv.data()+offset,sv.size()-offset);
        bool is_done = parser_.done() || done_;
        if (!is_done)
        {
            std::error_code local_ec;
            read_next(local_ec);
            if (local_ec)
            {
                if (local_ec == json_errc::unexpected_eof)
                {
                    done_ = true;
                }
                else
                {
                    ec = local_ec;
                }
            }
        }
    }